

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ToNumberHintFree(JSContext *ctx,JSValue val,JSToNumberHintEnum flag)

{
  JSValue val1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  JSContext *in_RDI;
  JSValue JVar5;
  int flags;
  size_t len;
  char *p;
  char *str;
  JSValue ret;
  uint32_t tag;
  JSContext *in_stack_fffffffffffffef0;
  JSValueUnion in_stack_fffffffffffffef8;
  JSContext *in_stack_ffffffffffffff00;
  JSValueUnion local_f0;
  int64_t local_e8;
  long local_c8;
  JSValueUnion local_80;
  int64_t local_78;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffb0;
  int32_t iVar9;
  undefined4 in_stack_ffffffffffffffb4;
  int64_t local_48;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_c;
  
  uVar6 = (undefined4)in_RSI;
  uVar7 = (undefined4)((ulong)in_RSI >> 0x20);
  iVar3 = (int)in_RDX;
  uVar8 = (undefined4)((ulong)in_RDX >> 0x20);
LAB_00157fd6:
  switch((size_t *)(ulong)(iVar3 + 8)) {
  case (size_t *)0x0:
    v_01.tag = (int64_t)in_stack_ffffffffffffff00;
    v_01.u.ptr = in_stack_fffffffffffffef8.ptr;
    JS_FreeValue(in_stack_fffffffffffffef0,v_01);
    JVar5 = JS_ThrowTypeError(in_RDI,"cannot convert symbol to number");
    iVar9 = JVar5.u._0_4_;
    in_stack_ffffffffffffffb4 = JVar5.u._4_4_;
    local_48 = JVar5.tag;
    goto LAB_00158434;
  case (size_t *)0x1:
    val1.tag = (int64_t)in_stack_ffffffffffffff00;
    val1.u.ptr = in_stack_fffffffffffffef8.ptr;
    pcVar4 = JS_ToCStringLen(in_stack_fffffffffffffef0,(size_t *)(ulong)(iVar3 + 8),val1);
    v.tag = (int64_t)in_stack_ffffffffffffff00;
    v.u.ptr = in_stack_fffffffffffffef8.ptr;
    JS_FreeValue(in_stack_fffffffffffffef0,v);
    if (pcVar4 == (char *)0x0) {
      iVar9 = 0;
      local_48 = 6;
      goto LAB_00158434;
    }
    iVar3 = skip_spaces((char *)in_stack_ffffffffffffff00);
    if (iVar3 == local_c8) {
      local_80.ptr = (void *)((ulong)in_stack_ffffffffffffffd4 << 0x20);
      local_78 = 0;
    }
    else {
      JVar5 = js_atof((JSContext *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8,
                      (char **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                     );
      local_f0 = JVar5.u;
      local_80 = local_f0;
      local_e8 = JVar5.tag;
      local_78 = local_e8;
      iVar2 = JS_IsException(JVar5);
      if ((iVar2 == 0) &&
         (iVar2 = skip_spaces((char *)in_stack_ffffffffffffff00),
         (long)iVar2 + (long)iVar3 != local_c8)) {
        v_00.tag = (int64_t)in_stack_ffffffffffffff00;
        v_00.u.ptr = in_stack_fffffffffffffef8.ptr;
        JS_FreeValue(in_stack_fffffffffffffef0,v_00);
        in_stack_ffffffffffffff00 = (JSContext *)0x7ff8000000000000;
        local_80.float64 = NAN;
        local_78 = 7;
      }
    }
    JS_FreeCString(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8.ptr);
    break;
  default:
    v_02.tag = (int64_t)in_stack_ffffffffffffff00;
    v_02.u.ptr = in_stack_fffffffffffffef8.ptr;
    JS_FreeValue(in_stack_fffffffffffffef0,v_02);
    local_80.float64 = NAN;
    local_78 = 7;
    break;
  case (size_t *)0x7:
    goto switchD_0015800f_caseD_7;
  case (size_t *)0x8:
  case (size_t *)0xe:
  case (size_t *)0xf:
    local_80._4_4_ = uVar7;
    local_80.int32 = uVar6;
    local_78 = CONCAT44(uVar8,iVar3);
    break;
  case (size_t *)0x9:
  case (size_t *)0xa:
    local_80._4_4_ = uStack_c;
    local_80.int32 = uVar6;
    local_78 = 0;
    break;
  case (size_t *)0xb:
    local_80.float64 = NAN;
    local_78 = 7;
  }
  iVar9 = local_80.int32;
  in_stack_ffffffffffffffb4 = local_80._4_4_;
  local_48 = local_78;
  goto LAB_00158434;
switchD_0015800f_caseD_7:
  JVar5.u._4_4_ = uVar8;
  JVar5.u.int32 = iVar3;
  JVar5.tag._0_4_ = in_stack_ffffffffffffffb0;
  JVar5.tag._4_4_ = in_stack_ffffffffffffffb4;
  JVar5 = JS_ToPrimitiveFree((JSContext *)CONCAT44(uVar7,uVar6),JVar5,(int)((ulong)in_RDI >> 0x20));
  uVar6 = JVar5.u._0_4_;
  uVar7 = JVar5.u._4_4_;
  iVar3 = (int)JVar5.tag;
  uVar8 = JVar5.tag._4_4_;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 != 0) {
    iVar9 = 0;
    local_48 = 6;
LAB_00158434:
    JVar1.u._4_4_ = in_stack_ffffffffffffffb4;
    JVar1.u.int32 = iVar9;
    JVar1.tag = local_48;
    return JVar1;
  }
  goto LAB_00157fd6;
}

Assistant:

static JSValue JS_ToNumberHintFree(JSContext *ctx, JSValue val,
                                   JSToNumberHintEnum flag)
{
    uint32_t tag;
    JSValue ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_DECIMAL:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigdecimal to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_INT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigint to number");
        }
        ret = val;
        break;
    case JS_TAG_BIG_FLOAT:
        if (flag != TON_FLAG_NUMERIC) {
            JS_FreeValue(ctx, val);
            return JS_ThrowTypeError(ctx, "cannot convert bigfloat to number");
        }
        ret = val;
        break;
#endif
    case JS_TAG_FLOAT64:
    case JS_TAG_INT:
    case JS_TAG_EXCEPTION:
        ret = val;
        break;
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        ret = JS_NewInt32(ctx, JS_VALUE_GET_INT(val));
        break;
    case JS_TAG_UNDEFINED:
        ret = JS_NAN;
        break;
    case JS_TAG_OBJECT:
        val = JS_ToPrimitiveFree(ctx, val, HINT_NUMBER);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        goto redo;
    case JS_TAG_STRING:
        {
            const char *str;
            const char *p;
            size_t len;
            
            str = JS_ToCStringLen(ctx, &len, val);
            JS_FreeValue(ctx, val);
            if (!str)
                return JS_EXCEPTION;
            p = str;
            p += skip_spaces(p);
            if ((p - str) == len) {
                ret = JS_NewInt32(ctx, 0);
            } else {
                int flags = ATOD_ACCEPT_BIN_OCT;
                ret = js_atof(ctx, p, &p, 0, flags);
                if (!JS_IsException(ret)) {
                    p += skip_spaces(p);
                    if ((p - str) != len) {
                        JS_FreeValue(ctx, ret);
                        ret = JS_NAN;
                    }
                }
            }
            JS_FreeCString(ctx, str);
        }
        break;
    case JS_TAG_SYMBOL:
        JS_FreeValue(ctx, val);
        return JS_ThrowTypeError(ctx, "cannot convert symbol to number");
    default:
        JS_FreeValue(ctx, val);
        ret = JS_NAN;
        break;
    }
    return ret;
}